

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void load_extensions(MOJOSHADER_glGetProcAddress lookup,void *d)

{
  MOJOSHADER_glContext *pMVar1;
  int iVar2;
  GLenum GVar3;
  StringCache *cache;
  GLubyte *pGVar4;
  char *pcVar5;
  byte *str;
  GLubyte *pGVar6;
  long lVar7;
  GLuint GVar8;
  byte *pbVar9;
  byte bVar10;
  ulong uVar11;
  GLint num_exts;
  
  cache = stringcache_create(ctx->malloc_fn,ctx->free_fn,ctx->malloc_data);
  pMVar1 = ctx;
  if (cache == (StringCache *)0x0) {
    out_of_memory();
    return;
  }
  pMVar1->have_core_opengl = 1;
  pMVar1->have_opengl_2 = 1;
  pMVar1->have_opengl_3 = 1;
  pMVar1->have_GL_ARB_vertex_program = 1;
  pMVar1->have_GL_ARB_fragment_program = 1;
  pMVar1->have_GL_NV_vertex_program2_option = 1;
  pMVar1->have_GL_NV_fragment_program2 = 1;
  pMVar1->have_GL_NV_vertex_program3 = 1;
  pMVar1->have_GL_NV_gpu_program4 = 1;
  pMVar1->have_GL_ARB_shader_objects = 1;
  pMVar1->have_GL_ARB_vertex_shader = 1;
  pMVar1->have_GL_ARB_fragment_shader = 1;
  pMVar1->have_GL_ARB_shading_language_100 = 1;
  pMVar1->have_GL_NV_half_float = 1;
  pMVar1->have_GL_ARB_half_float_vertex = 1;
  pMVar1->have_GL_OES_vertex_half_float = 1;
  pMVar1->have_GL_ARB_instanced_arrays = 1;
  lookup_entry_points(lookup,d);
  if (ctx->have_core_opengl == 0) {
    set_error("missing basic OpenGL entry points");
  }
  else {
    pGVar4 = (*ctx->glGetString)(0x1f02);
    pcVar5 = strstr((char *)pGVar4,"OpenGL ES ");
    pMVar1 = ctx;
    if (pcVar5 != (char *)0x0) {
      ctx->have_opengl_es = 1;
      pGVar4 = pGVar4 + 10;
    }
    parse_opengl_version_str((char *)pGVar4,&pMVar1->opengl_major,&pMVar1->opengl_minor);
    if ((ctx->have_opengl_3 == 0) ||
       ((int)((uint)(ushort)ctx->opengl_minor | ctx->opengl_major << 0x10) < 0x30000)) {
      str = (*ctx->glGetString)(0x1f03);
      ctx->have_opengl_3 = 0;
      while ((uVar11 = (ulong)*str, uVar11 < 0x21 && ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0)))
      {
        str = str + 1;
      }
      while( true ) {
        lVar7 = 0;
        pbVar9 = str;
        while( true ) {
          pbVar9 = pbVar9 + 1;
          bVar10 = (byte)uVar11;
          if ((bVar10 == 0) || ((bVar10 < 0x21 && ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))))
          break;
          uVar11 = (ulong)str[lVar7 + 1];
          lVar7 = lVar7 + 1;
        }
        if ((lVar7 != 0) &&
           (pcVar5 = stringcache_len(cache,(char *)str,(uint)lVar7), pcVar5 == (char *)0x0)) break;
        if (bVar10 == 0) goto LAB_00120046;
        while ((uVar11 = (ulong)*pbVar9, str = pbVar9, uVar11 < 0x21 &&
               ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))) {
          pbVar9 = pbVar9 + 1;
        }
      }
      out_of_memory();
    }
    else {
      num_exts = 0;
      (*ctx->glGetIntegerv)(0x821d,&num_exts);
      for (GVar8 = 0; (int)GVar8 < num_exts; GVar8 = GVar8 + 1) {
        pGVar4 = (*ctx->glGetStringi)(0x1f03,GVar8);
        pcVar5 = stringcache(cache,(char *)pGVar4);
        if (pcVar5 == (char *)0x0) {
          out_of_memory();
        }
      }
    }
  }
LAB_00120046:
  pMVar1 = ctx;
  if ((ctx->have_opengl_2 != 0) &&
     ((int)((uint)(ushort)ctx->opengl_minor | ctx->opengl_major << 0x10) < 0x20000)) {
    ctx->have_opengl_2 = 0;
    pMVar1->glUniform1i = pMVar1->glUniform1iARB;
    pMVar1->glUniform4fv = pMVar1->glUniform4fvARB;
    pMVar1->glUniform4iv = pMVar1->glUniform4ivARB;
    pMVar1->glDisableVertexAttribArray = pMVar1->glDisableVertexAttribArrayARB;
    pMVar1->glEnableVertexAttribArray = pMVar1->glEnableVertexAttribArrayARB;
    pMVar1->glVertexAttribPointer = pMVar1->glVertexAttribPointerARB;
  }
  iVar2 = verify_extension("GL_ARB_vertex_program",pMVar1->have_GL_ARB_vertex_program,cache,-1,-1);
  pMVar1 = ctx;
  ctx->have_GL_ARB_vertex_program = iVar2;
  iVar2 = verify_extension("GL_ARB_fragment_program",pMVar1->have_GL_ARB_fragment_program,cache,-1,
                           -1);
  pMVar1 = ctx;
  ctx->have_GL_ARB_fragment_program = iVar2;
  iVar2 = verify_extension("GL_ARB_shader_objects",pMVar1->have_GL_ARB_shader_objects,cache,-1,-1);
  pMVar1 = ctx;
  ctx->have_GL_ARB_shader_objects = iVar2;
  iVar2 = verify_extension("GL_ARB_vertex_shader",pMVar1->have_GL_ARB_vertex_shader,cache,-1,-1);
  pMVar1 = ctx;
  ctx->have_GL_ARB_vertex_shader = iVar2;
  iVar2 = verify_extension("GL_ARB_fragment_shader",pMVar1->have_GL_ARB_fragment_shader,cache,-1,-1)
  ;
  pMVar1 = ctx;
  ctx->have_GL_ARB_fragment_shader = iVar2;
  iVar2 = verify_extension("GL_ARB_shading_language_100",pMVar1->have_GL_ARB_shading_language_100,
                           cache,-1,-1);
  pMVar1 = ctx;
  ctx->have_GL_ARB_shading_language_100 = iVar2;
  iVar2 = verify_extension("GL_NV_vertex_program2_option",pMVar1->have_GL_NV_vertex_program2_option,
                           cache,-1,-1);
  pMVar1 = ctx;
  ctx->have_GL_NV_vertex_program2_option = iVar2;
  iVar2 = verify_extension("GL_NV_fragment_program2",pMVar1->have_GL_NV_fragment_program2,cache,-1,
                           -1);
  pMVar1 = ctx;
  ctx->have_GL_NV_fragment_program2 = iVar2;
  iVar2 = verify_extension("GL_NV_vertex_program3",pMVar1->have_GL_NV_vertex_program3,cache,-1,-1);
  pMVar1 = ctx;
  ctx->have_GL_NV_vertex_program3 = iVar2;
  iVar2 = verify_extension("GL_NV_half_float",pMVar1->have_GL_NV_half_float,cache,-1,-1);
  pMVar1 = ctx;
  ctx->have_GL_NV_half_float = iVar2;
  iVar2 = verify_extension("GL_ARB_half_float_vertex",pMVar1->have_GL_ARB_half_float_vertex,cache,3,
                           0);
  pMVar1 = ctx;
  ctx->have_GL_ARB_half_float_vertex = iVar2;
  iVar2 = verify_extension("GL_OES_vertex_half_float",pMVar1->have_GL_OES_vertex_half_float,cache,-1
                           ,-1);
  pMVar1 = ctx;
  ctx->have_GL_OES_vertex_half_float = iVar2;
  iVar2 = verify_extension("GL_ARB_instanced_arrays",pMVar1->have_GL_ARB_instanced_arrays,cache,3,3)
  ;
  ctx->have_GL_ARB_instanced_arrays = iVar2;
  stringcache_destroy(cache);
  pMVar1 = ctx;
  pMVar1->glsl_major = 0;
  pMVar1->glsl_minor = 0;
  if ((pMVar1->have_core_opengl != 0) &&
     ((pMVar1->have_opengl_2 != 0 ||
      ((((pMVar1->have_GL_ARB_shader_objects != 0 && (pMVar1->have_GL_ARB_vertex_shader != 0)) &&
        (pMVar1->have_GL_ARB_fragment_shader != 0)) &&
       (pMVar1->have_GL_ARB_shading_language_100 != 0)))))) {
    (*pMVar1->glGetError)();
    pGVar6 = (*ctx->glGetString)(0x8b8c);
    GVar3 = (*ctx->glGetError)();
    pGVar4 = (GLubyte *)0x0;
    if (GVar3 != 0x500) {
      pGVar4 = pGVar6;
    }
    pcVar5 = strstr((char *)pGVar4,"OpenGL ES GLSL ");
    lVar7 = 0xf;
    if (pcVar5 == (char *)0x0) {
      lVar7 = 0;
    }
    pcVar5 = strstr((char *)(pGVar4 + lVar7),"ES ");
    parse_opengl_version_str
              ((char *)(pGVar4 + lVar7 + (ulong)(pcVar5 != (char *)0x0) * 3),&ctx->glsl_major,
               &ctx->glsl_minor);
  }
  return;
}

Assistant:

static void load_extensions(MOJOSHADER_glGetProcAddress lookup, void *d)
{
    StringCache *exts = stringcache_create(ctx->malloc_fn, ctx->free_fn, ctx->malloc_data);
    if (!exts)
    {
        out_of_memory();
        return;
    } // if

    ctx->have_core_opengl = 1;
    ctx->have_opengl_2 = 1;
    ctx->have_opengl_3 = 1;
    ctx->have_GL_ARB_vertex_program = 1;
    ctx->have_GL_ARB_fragment_program = 1;
    ctx->have_GL_NV_vertex_program2_option = 1;
    ctx->have_GL_NV_fragment_program2 = 1;
    ctx->have_GL_NV_vertex_program3 = 1;
    ctx->have_GL_NV_gpu_program4 = 1;
    ctx->have_GL_ARB_shader_objects = 1;
    ctx->have_GL_ARB_vertex_shader = 1;
    ctx->have_GL_ARB_fragment_shader = 1;
    ctx->have_GL_ARB_shading_language_100 = 1;
    ctx->have_GL_NV_half_float = 1;
    ctx->have_GL_ARB_half_float_vertex = 1;
    ctx->have_GL_OES_vertex_half_float = 1;
    ctx->have_GL_ARB_instanced_arrays = 1;

    lookup_entry_points(lookup, d);

    if (!ctx->have_core_opengl)
        set_error("missing basic OpenGL entry points");
    else
    {
        const char *str = (const char *) ctx->glGetString(GL_VERSION);
        if (strstr(str, "OpenGL ES "))
        {
            ctx->have_opengl_es = 1;
            str += 10;
        }
        parse_opengl_version_str(str, &ctx->opengl_major, &ctx->opengl_minor);

        if ((ctx->have_opengl_3) && (opengl_version_atleast(3, 0)))
        {
            GLint i;
            GLint num_exts = 0;
            ctx->glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
            for (i = 0; i < num_exts; i++)
            {
                if (!stringcache(exts, (const char *) ctx->glGetStringi(GL_EXTENSIONS, i)))
                    out_of_memory();
            } // for
        } // if
        else
        {
            const char *str = (const char *) ctx->glGetString(GL_EXTENSIONS);
            const char *ext;
            ctx->have_opengl_3 = 0;

            while (*str && iswhitespace(*str))
                str++;
            ext = str;

            while (1)
            {
                const char ch = *str;
                if (ch && (!iswhitespace(ch)))
                {
                    str++;
                    continue;
                } // else if

                if (str != ext)
                {
                    if (!stringcache_len(exts, ext, (unsigned int) (str - ext)))
                    {
                        out_of_memory();
                        break;
                    } // if
                } // if

                if (ch == '\0')
                    break;

                str++;
                while (*str && iswhitespace(*str))
                    str++;
                ext = str;
            } // while
        } // else
    } // else

    if ((ctx->have_opengl_2) && (!opengl_version_atleast(2, 0)))
    {
        ctx->have_opengl_2 = 0;  // Not GL2! must have the ARB extensions!

        // Force compatible ARB function pointers in...this keeps the code
        //  cleaner when they are identical, so we don't have to if/else
        //  every function call, but we definitely have the right entry
        //  point. Be careful what you add here.
        // These may be NULL, btw.
        ctx->glUniform1i = ctx->glUniform1iARB;
        ctx->glUniform4fv = ctx->glUniform4fvARB;
        ctx->glUniform4iv = ctx->glUniform4ivARB;
        ctx->glDisableVertexAttribArray = ctx->glDisableVertexAttribArrayARB;
        ctx->glEnableVertexAttribArray = ctx->glEnableVertexAttribArrayARB;
        ctx->glVertexAttribPointer = ctx->glVertexAttribPointerARB;
    } // if

    #define VERIFY_EXT(ext, major, minor) \
        ctx->have_##ext = verify_extension(#ext, ctx->have_##ext, exts, major, minor)

    VERIFY_EXT(GL_ARB_vertex_program, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_program, -1, -1);
    VERIFY_EXT(GL_ARB_shader_objects, -1, -1);
    VERIFY_EXT(GL_ARB_vertex_shader, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_shader, -1, -1);
    VERIFY_EXT(GL_ARB_shading_language_100, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program2_option, -1, -1);
    VERIFY_EXT(GL_NV_fragment_program2, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program3, -1, -1);
    VERIFY_EXT(GL_NV_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_half_float_vertex, 3, 0);
    VERIFY_EXT(GL_OES_vertex_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_instanced_arrays, 3, 3);

    #undef VERIFY_EXT

    stringcache_destroy(exts);

    detect_glsl_version();
}